

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_String __thiscall ON_String::ApproximateFromNumber(ON_String *this,double d)

{
  int iVar1;
  char local_58 [8];
  char buffer [64];
  double d_local;
  
  buffer._56_8_ = d;
  if ((((d != 0.0) || (NAN(d))) && ((NAN(d) || ((ABS(d) < 1e-16 || (1e+16 < ABS(d))))))) ||
     (iVar1 = FormatIntoBuffer(local_58,0x40,"%f",d), iVar1 < 1)) {
    iVar1 = FormatIntoBuffer(local_58,0x40,"%g",buffer._56_8_);
    if (iVar1 < 1) {
      ON_String(this,&EmptyString);
    }
    else {
      ON_String(this,local_58);
    }
  }
  else {
    ON_String(this,local_58);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ApproximateFromNumber(
  double d
  )
{
  char buffer[64];
  if (0.0 == d || (d == d && fabs(d) >= 1.0e-16 && fabs(d) <= 1.0e16))
  {
    // Do not use %f without making sure the number is in a range
    // reasonable for %f.  Otherwise we end up with number strings
    // thate are 300 digits long when a 1e300 comes by.
    if (ON_String::FormatIntoBuffer(buffer, sizeof(buffer) / sizeof(buffer[0]), "%f", d) > 0)
      return ON_String(buffer);
    // It may be that 64 elements were not enough for %f format if the "reasonable range"
    // test is not good enough.  We try again with "%g".
  }
  if (ON_String::FormatIntoBuffer(buffer, sizeof(buffer) / sizeof(buffer[0]), "%g", d) > 0)
    return ON_String(buffer);
  return ON_String::EmptyString;
}